

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

string * __thiscall Assimp::FIBoolValueImpl::toString_abi_cxx11_(FIBoolValueImpl *this)

{
  anon_class_16_2_7fa2732d __f;
  vector<bool,_std::allocator<bool>_> *this_00;
  const_iterator cVar1;
  _Bit_const_iterator __last;
  _Bit_const_iterator __first;
  string local_218 [32];
  anon_class_16_2_7fa2732d local_1f8;
  int *local_1e8;
  ostringstream *local_1e0;
  _Bit_type *local_1d8;
  uint local_1d0;
  _Bit_type *local_1c8;
  uint local_1c0;
  _Bit_type *local_1b8;
  uint local_1b0;
  _Bit_type *local_1a8;
  uint local_1a0;
  int local_198 [2];
  int n;
  ostringstream local_188 [8];
  ostringstream os;
  FIBoolValueImpl *this_local;
  
  if ((this->strValueValid & 1U) == 0) {
    this->strValueValid = true;
    std::__cxx11::ostringstream::ostringstream(local_188);
    std::ostream::operator<<(local_188,std::boolalpha);
    local_198[0] = 0;
    this_00 = &(this->super_FIBoolValue).value;
    cVar1 = std::vector<bool,_std::allocator<bool>_>::begin(this_00);
    local_1b8 = cVar1.super__Bit_iterator_base._M_p;
    local_1b0 = cVar1.super__Bit_iterator_base._M_offset;
    local_1a8 = local_1b8;
    local_1a0 = local_1b0;
    cVar1 = std::vector<bool,_std::allocator<bool>_>::end(this_00);
    local_1d8 = cVar1.super__Bit_iterator_base._M_p;
    local_1d0 = cVar1.super__Bit_iterator_base._M_offset;
    local_1e8 = local_198;
    local_1e0 = (ostringstream *)local_188;
    __first.super__Bit_iterator_base._M_offset = local_1a0;
    __first.super__Bit_iterator_base._M_p = local_1a8;
    __f.os = local_1e0;
    __f.n = local_1e8;
    __last.super__Bit_iterator_base._12_4_ = 0;
    __last.super__Bit_iterator_base._M_p =
         (_Bit_type *)SUB128(cVar1.super__Bit_iterator_base._0_12_,0);
    __last.super__Bit_iterator_base._M_offset = SUB124(cVar1.super__Bit_iterator_base._0_12_,8);
    __first.super__Bit_iterator_base._12_4_ = 0;
    local_1c8 = local_1d8;
    local_1c0 = local_1d0;
    local_1f8 = std::
                for_each<std::_Bit_const_iterator,Assimp::FIBoolValueImpl::toString[abi:cxx11]()const::_lambda(bool)_1_>
                          (__first,__last,__f);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)&this->strValue,local_218);
    std::__cxx11::string::~string(local_218);
    std::__cxx11::ostringstream::~ostringstream(local_188);
  }
  return &this->strValue;
}

Assistant:

virtual const std::string &toString() const /*override*/ {
        if (!strValueValid) {
            strValueValid = true;
            std::ostringstream os;
            os << std::boolalpha;
            int n = 0;
            std::for_each(value.begin(), value.end(), [&](bool b) { if (++n > 1) os << ' '; os << b; });
            strValue = os.str();
        }
        return strValue;
    }